

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O3

int ecp_mod_p224(mbedtls_mpi *N)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  char cVar20;
  mbedtls_mpi C;
  mbedtls_mpi_uint Cp [4];
  uint local_78;
  mbedtls_mpi local_70;
  mbedtls_mpi_uint local_58 [5];
  
  local_70.s = 1;
  local_70.n = 4;
  local_70.p = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  iVar3 = mbedtls_mpi_grow(N,7);
  if (iVar3 == 0) {
    pmVar2 = N->p;
    uVar10 = (uint)*pmVar2;
    uVar8 = (uint)(pmVar2[3] >> 0x20);
    uVar13 = uVar10 - uVar8;
    uVar7 = (uint)(pmVar2[5] >> 0x20);
    uVar16 = -(uint)(uVar13 < uVar7) - (uint)(uVar10 < uVar8);
    uVar18 = (uint)(*pmVar2 >> 0x20);
    if ((uVar10 < uVar8) || (uVar13 < uVar7)) {
      cVar20 = -(uVar18 < -uVar16);
    }
    else {
      cVar20 = CARRY4(uVar16,uVar18);
    }
    uVar11 = (uint)pmVar2[4];
    uVar17 = (uVar16 + uVar18) - uVar11;
    uVar10 = (uint)pmVar2[6];
    cVar20 = (cVar20 - (uVar16 + uVar18 < uVar11)) - (uVar17 < uVar10);
    *pmVar2 = CONCAT44(uVar17 - uVar10,uVar13 - uVar7);
    uVar18 = (uint)cVar20;
    uVar13 = (uint)pmVar2[1];
    if (cVar20 < '\0') {
      cVar20 = -(uVar13 < -uVar18);
    }
    else {
      cVar20 = CARRY4(uVar18,uVar13);
    }
    uVar17 = (uint)(pmVar2[4] >> 0x20);
    uVar19 = (uVar18 + uVar13) - uVar17;
    uVar16 = (uint)(pmVar2[6] >> 0x20);
    cVar20 = (cVar20 - (uVar18 + uVar13 < uVar17)) - (uVar19 < uVar16);
    uVar18 = (uint)cVar20;
    uVar13 = (uint)(pmVar2[1] >> 0x20);
    if (cVar20 < '\0') {
      cVar20 = -(uVar13 < -uVar18);
    }
    else {
      cVar20 = CARRY4(uVar18,uVar13);
    }
    uVar5 = (uint)pmVar2[5];
    uVar14 = (uVar18 + uVar13) - uVar5;
    uVar15 = uVar14 + uVar8;
    cVar20 = CARRY4(uVar14,uVar8) + (cVar20 - (uVar18 + uVar13 < uVar5)) + CARRY4(uVar15,uVar7);
    pmVar2[1] = CONCAT44(uVar15 + uVar7,uVar19 - uVar16);
    uVar18 = (uint)cVar20;
    uVar8 = (uint)pmVar2[2];
    if (cVar20 < '\0') {
      cVar20 = -(uVar8 < -uVar18);
    }
    else {
      cVar20 = CARRY4(uVar18,uVar8);
    }
    uVar13 = (uVar18 + uVar8) - uVar7;
    uVar19 = uVar13 + uVar11;
    cVar20 = CARRY4(uVar13,uVar11) + (cVar20 - (uVar18 + uVar8 < uVar7)) + CARRY4(uVar19,uVar10);
    uVar7 = (uint)cVar20;
    uVar18 = (uint)(pmVar2[2] >> 0x20);
    if (cVar20 < '\0') {
      cVar20 = -(uVar18 < -uVar7);
    }
    else {
      cVar20 = CARRY4(uVar7,uVar18);
    }
    uVar8 = (uVar7 + uVar18) - uVar10;
    uVar13 = uVar8 + uVar17;
    cVar20 = CARRY4(uVar8,uVar17) + (cVar20 - (uVar7 + uVar18 < uVar10)) + CARRY4(uVar13,uVar16);
    pmVar2[2] = CONCAT44(uVar13 + uVar16,uVar19 + uVar10);
    uVar7 = (uint)cVar20;
    local_78 = (uint)pmVar2[3];
    if (cVar20 < '\0') {
      cVar20 = -(local_78 < -uVar7);
    }
    else {
      cVar20 = CARRY4(uVar7,local_78);
    }
    uVar18 = (uVar7 + local_78) - uVar16;
    cVar6 = (cVar20 - (uVar7 + local_78 < uVar16)) + CARRY4(uVar18,uVar5);
    cVar20 = '\0';
    if ('\0' < cVar6) {
      cVar20 = cVar6;
    }
    pmVar2[3] = (ulong)CONCAT14(cVar20,uVar18 + uVar5);
    if (8 < N->n * 2) {
      uVar9 = 7;
      do {
        uVar12 = 0xffffffff00000000;
        if ((uVar9 & 1) == 0) {
          uVar12 = 0xffffffff;
        }
        puVar1 = (ulong *)((long)pmVar2 + (uVar9 + 1 & 0xfffffffffffffffe) * 4);
        *puVar1 = *puVar1 & uVar12;
        uVar12 = uVar9 + 2;
        uVar9 = uVar9 + 1;
      } while (uVar12 < N->n * 2);
    }
    if (cVar6 < '\0') {
      local_58[3] = (long)cVar6 * -0x100000000;
      iVar4 = mbedtls_mpi_sub_abs(N,&local_70,N);
      if (iVar4 == 0) {
        N->s = -1;
      }
    }
  }
  return iVar3;
}

Assistant:

static int ecp_mod_p224( mbedtls_mpi *N )
{
    INIT( 224 );

    SUB(  7 ); SUB( 11 );               NEXT; // A0 += -A7 - A11
    SUB(  8 ); SUB( 12 );               NEXT; // A1 += -A8 - A12
    SUB(  9 ); SUB( 13 );               NEXT; // A2 += -A9 - A13
    SUB( 10 ); ADD(  7 ); ADD( 11 );    NEXT; // A3 += -A10 + A7 + A11
    SUB( 11 ); ADD(  8 ); ADD( 12 );    NEXT; // A4 += -A11 + A8 + A12
    SUB( 12 ); ADD(  9 ); ADD( 13 );    NEXT; // A5 += -A12 + A9 + A13
    SUB( 13 ); ADD( 10 );               LAST; // A6 += -A13 + A10

cleanup:
    return( ret );
}